

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall DReachabilityPropagator::wakeup(DReachabilityPropagator *this,int i,int param_3)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int in_ESI;
  long in_RDI;
  bool ignore;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  value_type_conflict *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  
  update_innodes((DReachabilityPropagator *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  bVar1 = true;
  if ((-1 < in_ESI) &&
     (iVar3 = GraphPropagator::nbNodes((GraphPropagator *)0x2aedd2), in_ESI < iVar3)) {
    GraphPropagator::getNodeVar
              ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
    bVar2 = BoolView::isTrue((BoolView *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if ((bVar2) &&
       (iVar3 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 200) + (long)in_ESI * 4)),
       iVar3 != 0)) {
      add_innode((DReachabilityPropagator *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      bVar1 = false;
    }
    else {
      GraphPropagator::getNodeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      bVar2 = BoolView::isFalse((BoolView *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if ((bVar2) &&
         (iVar3 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 200) + (long)in_ESI * 4)),
         iVar3 != 1)) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        bVar1 = false;
      }
    }
  }
  iVar3 = GraphPropagator::nbNodes((GraphPropagator *)0x2aeece);
  if (iVar3 <= in_ESI) {
    in_stack_ffffffffffffff94 = in_ESI;
    in_stack_ffffffffffffff90 = GraphPropagator::nbNodes((GraphPropagator *)0x2aeeee);
    iVar3 = GraphPropagator::nbEdges((GraphPropagator *)0x2aeefc);
    if (in_stack_ffffffffffffff94 < in_stack_ffffffffffffff90 + iVar3) {
      iVar3 = GraphPropagator::nbNodes((GraphPropagator *)0x2aef22);
      iVar3 = in_ESI - iVar3;
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_ESI);
      bVar2 = BoolView::isTrue((BoolView *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if ((bVar2) &&
         (iVar4 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0xd0) + (long)iVar3 * 4)),
         iVar4 != 0)) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        bVar1 = false;
      }
      else {
        GraphPropagator::getEdgeVar
                  ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_ESI);
        bVar2 = BoolView::isFalse((BoolView *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if ((bVar2) &&
           (iVar3 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0xd0) + (long)iVar3 * 4))
           , iVar3 != 1)) {
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
          bVar1 = false;
        }
      }
    }
  }
  if (!bVar1) {
    Propagator::pushInQueue
              ((Propagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  return;
}

Assistant:

void DReachabilityPropagator::wakeup(int i, int /*c*/) {
	update_innodes();

	bool ignore = true;
	if (DEBUG) {
		std::cout << "Wake up " << i << '\n';
	}
	if (i >= 0 && i < nbNodes()) {
		assert(getNodeVar(i).isFixed());
		if (getNodeVar(i).isTrue() && last_state_n[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add node " << i << '\n';
			}
			if (DEBUG) {
				std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
			}
			add_innode(i);
			new_node.insert(i);
			ignore = false;
		} else if (getNodeVar(i).isFalse() && last_state_n[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem node " << i << '\n';
			}
			rem_node.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring node " << i << '\n';
			}
		}
	}

	if (i >= nbNodes() && i < nbNodes() + nbEdges()) {
		i = i - nbNodes();
		assert(getEdgeVar(i).isFixed());
		if (getEdgeVar(i).isTrue() && last_state_e[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add edge" << i << '\n';
			}
			new_edge.insert(i);
			ignore = false;
		} else if (getEdgeVar(i).isFalse() && last_state_e[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem edge " << i << '\n';
			}
			rem_edge.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring edge " << i << '\n';
			}
		}
	}

	if (!ignore) {
		pushInQueue();
	} else {
	}
}